

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_rust.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::debugging_internal::anon_unknown_0::RustSymbolParser::Emit
          (RustSymbolParser *this,char *token)

{
  size_t sVar1;
  size_t bytes_to_copy;
  size_t token_length;
  char *token_local;
  RustSymbolParser *this_local;
  
  if (this->silence_depth_ < 1) {
    sVar1 = strlen(token);
    if ((ulong)((long)this->out_end_ - (long)this->out_) < sVar1 + 1) {
      this_local._7_1_ = false;
    }
    else {
      memcpy(this->out_,token,sVar1 + 1);
      this->out_ = this->out_ + sVar1;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

ABSL_MUST_USE_RESULT bool Emit(const char* token) {
    if (silence_depth_ > 0) return true;
    const size_t token_length = std::strlen(token);
    const size_t bytes_to_copy = token_length + 1;  // token and final NUL
    if (static_cast<size_t>(out_end_ - out_) < bytes_to_copy) return false;
    std::memcpy(out_, token, bytes_to_copy);
    out_ += token_length;
    return true;
  }